

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O1

filepos_t UpdateDataSize(ebml_string *Element,bool_t bWithDefault,bool_t bForceWithoutMandatory,
                        int ForProfile)

{
  long lVar1;
  size_t sVar2;
  void *pvVar3;
  filepos_t fVar4;
  
  if (Element != (ebml_string *)0x0) {
    lVar1 = (**(code **)((long)(Element->Base).Base.Base.VMT + 0xa0))();
    if (lVar1 != 0) {
      sVar2 = strlen(Element->Buffer);
      (Element->Base).DataSize = sVar2;
    }
    pvVar3 = Node_InheritedVMT((node *)Element,0x47534245);
    fVar4 = (**(code **)((long)pvVar3 + 0x98))
                      (Element,bWithDefault,bForceWithoutMandatory,ForProfile);
    return fVar4;
  }
  __assert_fail("(const void*)(Element)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlstring.c"
                ,0x9c,"filepos_t UpdateDataSize(ebml_string *, bool_t, bool_t, int)");
}

Assistant:

static filepos_t UpdateDataSize(ebml_element *Element, bool_t bWithDefault, bool_t UNUSED_PARAM(bForceWithoutMandatory), int UNUSED_PARAM(ForProfile))
{
    if (!bWithDefault && EBML_ElementIsDefaultValue(Element))
        return 0;

    if (Element->DefaultSize > Element->DataSize)
        Element->DataSize = Element->DefaultSize;

    Element->bNeedDataSizeUpdate = 0;
#if !defined(NDEBUG)
    assert(!EBML_ElementNeedsDataSizeUpdate(Element, bWithDefault));
#endif
    return Element->DataSize;
}